

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O0

int fd_package_recv(int sock,int *fds,size_t nfds)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  cmsghdr *local_98;
  uint last;
  uint n;
  uint8_t dummy;
  iovec iov;
  int ret;
  int serrno;
  uint i;
  cmsghdr *cmsg;
  msghdr msg;
  size_t nfds_local;
  int *fds_local;
  int sock_local;
  
  msg._48_8_ = nfds;
  if (sock < 0) {
    __assert_fail("sock >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x11d,"int fd_package_recv(int, int *, size_t)");
  }
  if (nfds == 0) {
    __assert_fail("nfds > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x11e,"int fd_package_recv(int, int *, size_t)");
  }
  if (fds == (int *)0x0) {
    __assert_fail("fds != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x11f,"int fd_package_recv(int, int *, size_t)");
  }
  bzero(&cmsg,0x38);
  bzero(&n,0x10);
  _n = (long)&last + 3;
  iov.iov_base = (void *)0x1;
  msg._8_8_ = &n;
  msg.msg_iov = (iovec *)0x1;
  msg.msg_control = (void *)(msg._48_8_ * 0x18);
  msg.msg_iovlen = (size_t)calloc(1,(size_t)msg.msg_control);
  if ((void *)msg.msg_iovlen == (void *)0x0) {
    fds_local._4_4_ = -1;
  }
  else {
    iov.iov_len._4_4_ = -1;
    iVar1 = msg_recv(sock,(msghdr *)&cmsg);
    if (iVar1 != -1) {
      ret = 0;
      if (msg.msg_control < (void *)0x10) {
        local_98 = (cmsghdr *)0x0;
      }
      else {
        local_98 = (cmsghdr *)msg.msg_iovlen;
      }
      _serrno = local_98;
      for (; iVar1 = ret, _serrno != (cmsghdr *)0x0 && (ulong)(uint)ret < (ulong)msg._48_8_;
          ret = iVar2 + ret) {
        if ((_serrno->cmsg_level != 1) || (_serrno->cmsg_type != 1)) {
          piVar4 = __errno_location();
          *piVar4 = 0x16;
          break;
        }
        uVar3 = _serrno->cmsg_len - 0x10 >> 2;
        iVar2 = (int)uVar3;
        if ((ulong)msg._48_8_ < (ulong)(uint)(ret + iVar2)) {
          piVar4 = __errno_location();
          *piVar4 = 0x16;
          break;
        }
        bcopy(_serrno + 1,fds + (uint)ret,(uVar3 & 0xffffffff) << 2);
        _serrno = __cmsg_nxthdr((msghdr *)&cmsg,_serrno);
      }
      if ((_serrno == (cmsghdr *)0x0) && ((ulong)msg._48_8_ <= (ulong)(uint)ret)) {
        iov.iov_len._4_4_ = 0;
      }
      else {
        for (ret = 0; (uint)ret < (uint)iVar1; ret = ret + 1) {
          if (-1 < fds[(uint)ret]) {
            close(fds[(uint)ret]);
          }
        }
        piVar4 = __errno_location();
        *piVar4 = 0x16;
      }
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    free((void *)msg.msg_iovlen);
    piVar4 = __errno_location();
    *piVar4 = iVar1;
    fds_local._4_4_ = iov.iov_len._4_4_;
  }
  return fds_local._4_4_;
}

Assistant:

static int
fd_package_recv(int sock, int *fds, size_t nfds)
{
	struct msghdr msg;
	struct cmsghdr *cmsg;
	unsigned int i;
	int serrno, ret;
	struct iovec iov;
	uint8_t dummy;

	PJDLOG_ASSERT(sock >= 0);
	PJDLOG_ASSERT(nfds > 0);
	PJDLOG_ASSERT(fds != NULL);

	bzero(&msg, sizeof(msg));
	bzero(&iov, sizeof(iov));

	/*
	 * XXX: Look into cred_send function for more details.
	 */
	iov.iov_base = &dummy;
	iov.iov_len = sizeof(dummy);

	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_controllen = nfds * CMSG_SPACE(sizeof(int));
	msg.msg_control = calloc(1, msg.msg_controllen);
	if (msg.msg_control == NULL)
		return (-1);

	ret = -1;

	if (msg_recv(sock, &msg) == -1)
		goto end;

	i = 0;
	cmsg = CMSG_FIRSTHDR(&msg);
	while (cmsg && i < nfds) {
		unsigned int n;

		if (cmsg->cmsg_level != SOL_SOCKET ||
		    cmsg->cmsg_type != SCM_RIGHTS) {
			errno = EINVAL;
			break;
		}
		n = (cmsg->cmsg_len - CMSG_LEN(0)) / sizeof(int);
		if (i + n > nfds) {
			errno = EINVAL;
			break;
		}
		bcopy(CMSG_DATA(cmsg), fds + i, sizeof(int) * n);
		cmsg = CMSG_NXTHDR(&msg, cmsg);
		i += n;
	}

	if (cmsg != NULL || i < nfds) {
		unsigned int last;

		/*
		 * We need to close all received descriptors, even if we have
		 * different control message (eg. SCM_CREDS) in between.
		 */
		last = i;
		for (i = 0; i < last; i++) {
			if (fds[i] >= 0) {
				close(fds[i]);
			}
		}
		errno = EINVAL;
		goto end;
	}

#ifndef MSG_CMSG_CLOEXEC
	/*
	 * If the MSG_CMSG_CLOEXEC flag is not available we cannot set the
	 * close-on-exec flag atomically, but we still want to set it for
	 * consistency.
	 */
	for (i = 0; i < nfds; i++) {
		(void) fcntl(fds[i], F_SETFD, FD_CLOEXEC);
	}
#endif

	ret = 0;
end:
	serrno = errno;
	free(msg.msg_control);
	errno = serrno;
	return (ret);
}